

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
PluginManagerTest_PluginName_Test::~PluginManagerTest_PluginName_Test
          (PluginManagerTest_PluginName_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST( PluginManagerTest, PluginName )
{
	char pluginName[20];
	if ( IPluginManager::Get()->loadPlugin( "pluginA" ) )
	{
		auto plugin = IPluginManager::Get()->getPlugin( "pluginA" );
		strcpy( pluginName, plugin->name() );
		IPluginManager::Get()->unloadPlugin( "pluginA" );
	}

	EXPECT_STREQ( "PluginA", pluginName );
}